

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::CZString::~CZString(CZString *this)

{
  if ((this->cstr_ != (char *)0x0) && (((this->field_1).index_ & 3) == 1)) {
    free(this->cstr_);
    return;
  }
  return;
}

Assistant:

Value::CZString::~CZString() {
  if (cstr_ && storage_.policy_ == duplicate) {
    releaseStringValue(const_cast<char*>(cstr_),
                       storage_.length_ + 1U); // +1 for null terminating
                                               // character for sake of
                                               // completeness but not actually
                                               // necessary
  }
}